

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_sim.c
# Opt level: O2

int CVodeSetNonlinearSolverSensSim(void *cvode_mem,SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver_Ops p_Var1;
  int iVar2;
  long lVar3;
  int line;
  code *pcVar4;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar2 = -0x15;
    line = 0x3a;
  }
  else {
    if (NLS != (SUNNonlinearSolver)0x0) {
      p_Var1 = NLS->ops;
      if (((p_Var1->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
          (p_Var1->solve ==
           (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0))
         || (p_Var1->setsysfn == (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
        msgfmt = "NLS does not support required operations";
        line = 0x4b;
      }
      else if (*(int *)((long)cvode_mem + 0x8c) == 0) {
        msgfmt = "Forward sensitivity analysis not activated.";
        line = 0x53;
      }
      else if (*(int *)((long)cvode_mem + 0x94) == 1) {
        if ((*(long *)((long)cvode_mem + 0x738) != 0) && (*(int *)((long)cvode_mem + 0x740) != 0)) {
          SUNNonlinSolFree();
        }
        *(SUNNonlinearSolver *)((long)cvode_mem + 0x738) = NLS;
        *(undefined4 *)((long)cvode_mem + 0x740) = 0;
        iVar2 = SUNNonlinSolGetType(NLS);
        if (iVar2 == 0) {
          pcVar4 = cvNlsResidualSensSim;
        }
        else {
          iVar2 = SUNNonlinSolGetType(NLS);
          if (iVar2 != 1) {
            msgfmt = "Invalid nonlinear solver type";
            line = 0x78;
            goto LAB_001285e1;
          }
          pcVar4 = cvNlsFPFunctionSensSim;
        }
        iVar2 = SUNNonlinSolSetSysFn(*(undefined8 *)((long)cvode_mem + 0x738),pcVar4);
        if (iVar2 == 0) {
          iVar2 = SUNNonlinSolSetConvTestFn
                            (*(undefined8 *)((long)cvode_mem + 0x738),cvNlsConvTestSensSim,cvode_mem
                            );
          if (iVar2 == 0) {
            iVar2 = SUNNonlinSolSetMaxIters(*(undefined8 *)((long)cvode_mem + 0x738),3);
            if (iVar2 == 0) {
              if (*(int *)((long)cvode_mem + 0x7b8) == 0) {
                lVar3 = N_VNewEmpty_SensWrapper(*(int *)((long)cvode_mem + 0x90) + 1,*cvode_mem);
                *(long *)((long)cvode_mem + 0x788) = lVar3;
                if (lVar3 == 0) {
                  msgfmt = "A memory request failed.";
                  iVar2 = -0x14;
                  line = 0x9e;
                  goto LAB_00128606;
                }
                lVar3 = N_VNewEmpty_SensWrapper(*(int *)((long)cvode_mem + 0x90) + 1,*cvode_mem);
                *(long *)((long)cvode_mem + 0x790) = lVar3;
                if (lVar3 == 0) {
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x788));
                  msgfmt = "A memory request failed.";
                  iVar2 = -0x14;
                  line = 0xa8;
                  goto LAB_00128606;
                }
                lVar3 = N_VNewEmpty_SensWrapper(*(int *)((long)cvode_mem + 0x90) + 1,*cvode_mem);
                *(long *)((long)cvode_mem + 0x798) = lVar3;
                if (lVar3 == 0) {
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x788));
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x790));
                  msgfmt = "A memory request failed.";
                  iVar2 = -0x14;
                  line = 0xb3;
                  goto LAB_00128606;
                }
                *(undefined4 *)((long)cvode_mem + 0x7b8) = 1;
              }
              **(undefined8 **)**(undefined8 **)((long)cvode_mem + 0x788) =
                   *(undefined8 *)((long)cvode_mem + 0x150);
              **(undefined8 **)**(undefined8 **)((long)cvode_mem + 0x790) =
                   *(undefined8 *)((long)cvode_mem + 0x1c8);
              **(undefined8 **)**(undefined8 **)((long)cvode_mem + 0x798) =
                   *(undefined8 *)((long)cvode_mem + 0x1b8);
              iVar2 = *(int *)((long)cvode_mem + 0x90);
              for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
                *(undefined8 *)(*(long *)**(undefined8 **)((long)cvode_mem + 0x788) + 8 + lVar3 * 8)
                     = *(undefined8 *)(*(long *)((long)cvode_mem + 0x288) + lVar3 * 8);
                *(undefined8 *)(*(long *)**(undefined8 **)((long)cvode_mem + 0x790) + 8 + lVar3 * 8)
                     = *(undefined8 *)(*(long *)((long)cvode_mem + 0x300) + lVar3 * 8);
                *(undefined8 *)(*(long *)**(undefined8 **)((long)cvode_mem + 0x798) + 8 + lVar3 * 8)
                     = *(undefined8 *)(*(long *)((long)cvode_mem + 0x2f0) + lVar3 * 8);
              }
              *(undefined4 *)((long)cvode_mem + 0x560) = 0;
              if (*(long *)((long)cvode_mem + 0x10) != 0) {
                *(long *)((long)cvode_mem + 0x778) = *(long *)((long)cvode_mem + 0x10);
                return 0;
              }
              msgfmt = "The ODE RHS function is NULL";
              iVar2 = -0x16;
              line = 0xcd;
            }
            else {
              msgfmt = "Setting maximum number of nonlinear iterations failed";
              iVar2 = -0x16;
              line = 0x92;
            }
          }
          else {
            msgfmt = "Setting convergence test function failed";
            iVar2 = -0x16;
            line = 0x89;
          }
          goto LAB_00128606;
        }
        msgfmt = "Setting nonlinear system function failed";
        line = 0x7f;
      }
      else {
        msgfmt = "Sensitivity solution method is not CV_SIMULTANEOUS";
        line = 0x5b;
      }
LAB_001285e1:
      iVar2 = -0x16;
      goto LAB_00128606;
    }
    msgfmt = "NLS must be non-NULL";
    iVar2 = -0x16;
    line = 0x42;
  }
  cvode_mem = (CVodeMem)0x0;
LAB_00128606:
  cvProcessError((CVodeMem)cvode_mem,iVar2,line,"CVodeSetNonlinearSolverSensSim",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                 ,msgfmt);
  return iVar2;
}

Assistant:

int CVodeSetNonlinearSolverSensSim(void* cvode_mem, SUNNonlinearSolver NLS)
{
  CVodeMem cv_mem;
  int retval, is;

  /* Return immediately if CVode memory is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    cvProcessError(NULL, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS must be non-NULL");
    return (CV_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS does not support required operations");
    return (CV_ILL_INPUT);
  }

  /* check that sensitivities were initialized */
  if (!(cv_mem->cv_sensi))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_ILL_INPUT);
  }

  /* check that simultaneous corrector was selected */
  if (cv_mem->cv_ism != CV_SIMULTANEOUS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Sensitivity solution method is not CV_SIMULTANEOUS");
    return (CV_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((cv_mem->NLSsim != NULL) && (cv_mem->ownNLSsim))
  {
    retval = SUNNonlinSolFree(cv_mem->NLSsim);
  }

  /* set SUNNonlinearSolver pointer */
  cv_mem->NLSsim = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, CVODE will set the flag to SUNTRUE after this function returns. */
  cv_mem->ownNLSsim = SUNFALSE;

  /* set the nonlinear system function */
  if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_ROOTFIND)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLSsim, cvNlsResidualSensSim);
  }
  else if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_FIXEDPOINT)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLSsim, cvNlsFPFunctionSensSim);
  }
  else
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid nonlinear solver type");
    return (CV_ILL_INPUT);
  }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting nonlinear system function failed");
    return (CV_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(cv_mem->NLSsim, cvNlsConvTestSensSim,
                                     cvode_mem);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting convergence test function failed");
    return (CV_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(cv_mem->NLSsim, NLS_MAXCOR);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting maximum number of nonlinear iterations failed");
    return (CV_ILL_INPUT);
  }

  /* create vector wrappers if necessary */
  if (cv_mem->simMallocDone == SUNFALSE)
  {
    cv_mem->zn0Sim = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns + 1,
                                             cv_mem->cv_sunctx);
    if (cv_mem->zn0Sim == NULL)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->ycorSim = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns + 1,
                                              cv_mem->cv_sunctx);
    if (cv_mem->ycorSim == NULL)
    {
      N_VDestroy(cv_mem->zn0Sim);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->ewtSim = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns + 1,
                                             cv_mem->cv_sunctx);
    if (cv_mem->ewtSim == NULL)
    {
      N_VDestroy(cv_mem->zn0Sim);
      N_VDestroy(cv_mem->ycorSim);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->simMallocDone = SUNTRUE;
  }

  /* attach vectors to vector wrappers */
  NV_VEC_SW(cv_mem->zn0Sim, 0)  = cv_mem->cv_zn[0];
  NV_VEC_SW(cv_mem->ycorSim, 0) = cv_mem->cv_acor;
  NV_VEC_SW(cv_mem->ewtSim, 0)  = cv_mem->cv_ewt;

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    NV_VEC_SW(cv_mem->zn0Sim, is + 1)  = cv_mem->cv_znS[0][is];
    NV_VEC_SW(cv_mem->ycorSim, is + 1) = cv_mem->cv_acorS[is];
    NV_VEC_SW(cv_mem->ewtSim, is + 1)  = cv_mem->cv_ewtS[is];
  }

  /* Reset the acnrmcur flag to SUNFALSE */
  cv_mem->cv_acnrmcur = SUNFALSE;

  /* Set the nonlinear system RHS function */
  if (!(cv_mem->cv_f))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "The ODE RHS function is NULL");
    return (CV_ILL_INPUT);
  }
  cv_mem->nls_f = cv_mem->cv_f;

  return (CV_SUCCESS);
}